

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.c
# Opt level: O0

int check_extensions(X509_STORE_CTX *ctx)

{
  int depth;
  int iVar1;
  OPENSSL_STACK *pOVar2;
  X509 *x_00;
  X509_NAME *pXVar3;
  long lVar4;
  stack_st_X509_EXTENSION *sk;
  long in_RDI;
  int num;
  int allow_proxy_certs;
  int purpose;
  int proxy_path_length;
  int ret;
  X509 *x;
  int plen;
  int must_be_ca;
  int i;
  int in_stack_ffffffffffffffc0;
  uint depth_00;
  uint purpose_00;
  uint uVar5;
  int in_stack_ffffffffffffffd4;
  int local_1c;
  int local_18;
  int local_14;
  
  local_1c = 0;
  uVar5 = 0;
  pOVar2 = ossl_check_const_X509_sk_type(*(stack_st_X509 **)(in_RDI + 0x98));
  depth = OPENSSL_sk_num(pOVar2);
  local_18 = -1;
  if (*(long *)(in_RDI + 0xd8) == 0) {
    depth_00 = (uint)((*(ulong *)(*(long *)(in_RDI + 0x20) + 0x18) & 0x40) != 0);
    purpose_00 = *(uint *)(*(long *)(in_RDI + 0x20) + 0x20);
  }
  else {
    depth_00 = 0;
    purpose_00 = 6;
  }
  local_14 = 0;
  do {
    if (depth <= local_14) {
      return 1;
    }
    pOVar2 = ossl_check_const_X509_sk_type(*(stack_st_X509 **)(in_RDI + 0x98));
    x_00 = (X509 *)OPENSSL_sk_value(pOVar2,local_14);
    if ((((*(ulong *)(*(long *)(in_RDI + 0x20) + 0x18) & 0x10) == 0) &&
        ((x_00->ex_flags & 0x200) != 0)) &&
       (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                               (X509 *)CONCAT44(purpose_00,depth_00),depth,in_stack_ffffffffffffffc0
                              ), iVar1 == 0)) {
      return 0;
    }
    if (((depth_00 == 0) && ((x_00->ex_flags & 0x400) != 0)) &&
       (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                               (X509 *)((ulong)purpose_00 << 0x20),depth,in_stack_ffffffffffffffc0),
       iVar1 == 0)) {
      return 0;
    }
    in_stack_ffffffffffffffd4 = X509_check_ca((X509 *)x_00);
    in_stack_ffffffffffffffc0 = local_18;
    if (local_18 == -1) {
      if ((((*(ulong *)(*(long *)(in_RDI + 0x20) + 0x18) & 0x20) != 0) &&
          (in_stack_ffffffffffffffd4 != 1)) &&
         ((in_stack_ffffffffffffffd4 != 0 &&
          (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                  (X509 *)CONCAT44(purpose_00,depth_00),depth,-1),
          in_stack_ffffffffffffffc0 = local_18, iVar1 == 0)))) {
        return 0;
      }
    }
    else if (local_18 == 0) {
      if ((in_stack_ffffffffffffffd4 != 0) &&
         (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                 (X509 *)CONCAT44(purpose_00,depth_00),depth,0),
         in_stack_ffffffffffffffc0 = local_18, iVar1 == 0)) {
        return 0;
      }
    }
    else if (((in_stack_ffffffffffffffd4 == 0) ||
             (((local_14 + 1 < depth || ((*(ulong *)(*(long *)(in_RDI + 0x20) + 0x18) & 0x20) != 0))
              && (in_stack_ffffffffffffffd4 != 1)))) &&
            (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                    (X509 *)CONCAT44(purpose_00,depth_00),depth,local_18),
            in_stack_ffffffffffffffc0 = local_18, iVar1 == 0)) {
      return 0;
    }
    if (1 < depth) {
      in_stack_ffffffffffffffd4 = check_curve((X509 *)CONCAT44(purpose_00,depth_00));
      if ((in_stack_ffffffffffffffd4 < 0) &&
         (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                 (X509 *)CONCAT44(purpose_00,depth_00),depth,
                                 in_stack_ffffffffffffffc0), iVar1 == 0)) {
        return 0;
      }
      if ((in_stack_ffffffffffffffd4 == 0) &&
         (iVar1 = verify_cb_cert((X509_STORE_CTX *)(ulong)uVar5,
                                 (X509 *)CONCAT44(purpose_00,depth_00),depth,
                                 in_stack_ffffffffffffffc0), iVar1 == 0)) {
        return 0;
      }
    }
    if (((*(ulong *)(*(long *)(in_RDI + 0x20) + 0x18) & 0x20) != 0) && (1 < depth)) {
      if (x_00->ex_pathlen != -1) {
        if (((x_00->ex_flags & 0x10) == 0) &&
           (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                   (X509 *)CONCAT44(purpose_00,depth_00),depth,
                                   in_stack_ffffffffffffffc0), iVar1 == 0)) {
          return 0;
        }
        if (((x_00->ex_kusage & 4) == 0) &&
           (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                   (X509 *)CONCAT44(purpose_00,depth_00),depth,
                                   in_stack_ffffffffffffffc0), iVar1 == 0)) {
          return 0;
        }
      }
      if (((((x_00->ex_flags & 0x10) != 0) && ((x_00->ex_flags & 1) != 0)) &&
          ((x_00->ex_flags & 0x10000) == 0)) &&
         (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                 (X509 *)CONCAT44(purpose_00,depth_00),depth,
                                 in_stack_ffffffffffffffc0), iVar1 == 0)) {
        return 0;
      }
      if ((x_00->ex_flags & 0x10) == 0) {
        if (((x_00->ex_kusage & 4) != 0) &&
           (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                   (X509 *)CONCAT44(purpose_00,depth_00),depth,
                                   in_stack_ffffffffffffffc0), iVar1 == 0)) {
          return 0;
        }
      }
      else if (((x_00->ex_flags & 2) == 0) &&
              (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                      (X509 *)CONCAT44(purpose_00,depth_00),depth,
                                      in_stack_ffffffffffffffc0), iVar1 == 0)) {
        return 0;
      }
      pXVar3 = X509_get_issuer_name((X509 *)x_00);
      iVar1 = X509_NAME_entry_count(pXVar3);
      if ((iVar1 == 0) &&
         (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                 (X509 *)CONCAT44(purpose_00,depth_00),depth,
                                 in_stack_ffffffffffffffc0), iVar1 == 0)) {
        return 0;
      }
      if ((((x_00->ex_flags & 0x10) != 0) || ((x_00->ex_kusage & 2) != 0)) ||
         (x_00->altname == (stack_st_GENERAL_NAME *)0x0)) {
        pXVar3 = X509_get_subject_name((X509 *)x_00);
        iVar1 = X509_NAME_entry_count(pXVar3);
        if ((iVar1 == 0) &&
           (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                   (X509 *)CONCAT44(purpose_00,depth_00),depth,
                                   in_stack_ffffffffffffffc0), iVar1 == 0)) {
          return 0;
        }
      }
      pXVar3 = X509_get_subject_name((X509 *)x_00);
      iVar1 = X509_NAME_entry_count(pXVar3);
      if (((iVar1 == 0) && (x_00->altname != (stack_st_GENERAL_NAME *)0x0)) &&
         (((x_00->ex_flags & 0x80000) == 0 &&
          (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                  (X509 *)CONCAT44(purpose_00,depth_00),depth,
                                  in_stack_ffffffffffffffc0), iVar1 == 0)))) {
        return 0;
      }
      if (x_00->altname != (stack_st_GENERAL_NAME *)0x0) {
        pOVar2 = ossl_check_const_GENERAL_NAME_sk_type(x_00->altname);
        iVar1 = OPENSSL_sk_num(pOVar2);
        if ((iVar1 < 1) &&
           (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                   (X509 *)CONCAT44(purpose_00,depth_00),depth,
                                   in_stack_ffffffffffffffc0), iVar1 == 0)) {
          return 0;
        }
      }
      iVar1 = X509_ALGOR_cmp((X509_ALGOR *)&x_00->sig_alg,(X509_ALGOR *)&(x_00->cert_info).signature
                            );
      if ((iVar1 != 0) &&
         (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                 (X509 *)CONCAT44(purpose_00,depth_00),depth,
                                 in_stack_ffffffffffffffc0), iVar1 == 0)) {
        return 0;
      }
      if (((x_00->akid != (AUTHORITY_KEYID *)0x0) && ((x_00->ex_flags & 0x20000) != 0)) &&
         (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                 (X509 *)CONCAT44(purpose_00,depth_00),depth,
                                 in_stack_ffffffffffffffc0), iVar1 == 0)) {
        return 0;
      }
      if (((x_00->skid != (ASN1_OCTET_STRING *)0x0) && ((x_00->ex_flags & 0x40000) != 0)) &&
         (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                 (X509 *)CONCAT44(purpose_00,depth_00),depth,
                                 in_stack_ffffffffffffffc0), iVar1 == 0)) {
        return 0;
      }
      lVar4 = X509_get_version((X509 *)0x2d4e15);
      if (lVar4 < 2) {
        sk = X509_get0_extensions(x_00);
        pOVar2 = ossl_check_const_X509_EXTENSION_sk_type(sk);
        iVar1 = OPENSSL_sk_num(pOVar2);
        if ((0 < iVar1) &&
           (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                   (X509 *)CONCAT44(purpose_00,depth_00),depth,
                                   in_stack_ffffffffffffffc0), iVar1 == 0)) {
          return 0;
        }
      }
      else {
        if ((local_14 + 1 < depth) &&
           (((x_00->akid == (AUTHORITY_KEYID *)0x0 ||
             (x_00->akid->keyid == (ASN1_OCTET_STRING *)0x0)) &&
            (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                    (X509 *)CONCAT44(purpose_00,depth_00),depth,
                                    in_stack_ffffffffffffffc0), iVar1 == 0)))) {
          return 0;
        }
        if ((((x_00->ex_flags & 0x10) != 0) && (x_00->skid == (ASN1_OCTET_STRING *)0x0)) &&
           (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                   (X509 *)CONCAT44(purpose_00,depth_00),depth,
                                   in_stack_ffffffffffffffc0), iVar1 == 0)) {
          return 0;
        }
      }
    }
    if ((0 < (int)purpose_00) &&
       (iVar1 = check_purpose((X509_STORE_CTX *)x_00,
                              (X509 *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),purpose_00,depth_00,
                              depth), iVar1 == 0)) {
      return 0;
    }
    if ((((1 < local_14) && (x_00->ex_pathlen != -1)) &&
        (x_00->ex_pathlen + (long)(int)uVar5 < (long)local_1c)) &&
       (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                               (X509 *)CONCAT44(purpose_00,depth_00),depth,in_stack_ffffffffffffffc0
                              ), iVar1 == 0)) {
      return 0;
    }
    if ((0 < local_14) && ((x_00->ex_flags & 0x20) == 0)) {
      local_1c = local_1c + 1;
    }
    if ((x_00->ex_flags & 0x400) == 0) {
      local_18 = 1;
    }
    else {
      if (x_00->ex_pcpathlen != -1) {
        if ((x_00->ex_pcpathlen < (long)(int)uVar5) &&
           (iVar1 = verify_cb_cert((X509_STORE_CTX *)CONCAT44(in_stack_ffffffffffffffd4,uVar5),
                                   (X509 *)CONCAT44(purpose_00,depth_00),depth,
                                   in_stack_ffffffffffffffc0), iVar1 == 0)) {
          return 0;
        }
        uVar5 = (uint)x_00->ex_pcpathlen;
      }
      uVar5 = uVar5 + 1;
      local_18 = 0;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

static int check_extensions(X509_STORE_CTX *ctx)
{
    int i, must_be_ca, plen = 0;
    X509 *x;
    int ret, proxy_path_length = 0;
    int purpose, allow_proxy_certs, num = sk_X509_num(ctx->chain);

    /*-
     *  must_be_ca can have 1 of 3 values:
     * -1: we accept both CA and non-CA certificates, to allow direct
     *     use of self-signed certificates (which are marked as CA).
     * 0:  we only accept non-CA certificates.  This is currently not
     *     used, but the possibility is present for future extensions.
     * 1:  we only accept CA certificates.  This is currently used for
     *     all certificates in the chain except the leaf certificate.
     */
    must_be_ca = -1;

    /* CRL path validation */
    if (ctx->parent != NULL) {
        allow_proxy_certs = 0;
        purpose = X509_PURPOSE_CRL_SIGN;
    } else {
        allow_proxy_certs =
            (ctx->param->flags & X509_V_FLAG_ALLOW_PROXY_CERTS) != 0;
        purpose = ctx->param->purpose;
    }

    for (i = 0; i < num; i++) {
        x = sk_X509_value(ctx->chain, i);
        CB_FAIL_IF((ctx->param->flags & X509_V_FLAG_IGNORE_CRITICAL) == 0
                       && (x->ex_flags & EXFLAG_CRITICAL) != 0,
                   ctx, x, i, X509_V_ERR_UNHANDLED_CRITICAL_EXTENSION);
        CB_FAIL_IF(!allow_proxy_certs && (x->ex_flags & EXFLAG_PROXY) != 0,
                   ctx, x, i, X509_V_ERR_PROXY_CERTIFICATES_NOT_ALLOWED);
        ret = X509_check_ca(x);
        switch (must_be_ca) {
        case -1:
            CB_FAIL_IF((ctx->param->flags & X509_V_FLAG_X509_STRICT) != 0
                           && ret != 1 && ret != 0,
                       ctx, x, i, X509_V_ERR_INVALID_CA);
            break;
        case 0:
            CB_FAIL_IF(ret != 0, ctx, x, i, X509_V_ERR_INVALID_NON_CA);
            break;
        default:
            /* X509_V_FLAG_X509_STRICT is implicit for intermediate CAs */
            CB_FAIL_IF(ret == 0
                       || ((i + 1 < num
                            || (ctx->param->flags & X509_V_FLAG_X509_STRICT) != 0)
                           && ret != 1), ctx, x, i, X509_V_ERR_INVALID_CA);
            break;
        }
        if (num > 1) {
            /* Check for presence of explicit elliptic curve parameters */
            ret = check_curve(x);
            CB_FAIL_IF(ret < 0, ctx, x, i, X509_V_ERR_UNSPECIFIED);
            CB_FAIL_IF(ret == 0, ctx, x, i, X509_V_ERR_EC_KEY_EXPLICIT_PARAMS);
        }
        /*
         * Do the following set of checks only if strict checking is requested
         * and not for self-issued (including self-signed) EE (non-CA) certs
         * because RFC 5280 does not apply to them according RFC 6818 section 2.
         */
        if ((ctx->param->flags & X509_V_FLAG_X509_STRICT) != 0
            && num > 1) { /*
                           * this should imply
                           * !(i == 0 && (x->ex_flags & EXFLAG_CA) == 0
                           *          && (x->ex_flags & EXFLAG_SI) != 0)
                           */
            /* Check Basic Constraints according to RFC 5280 section 4.2.1.9 */
            if (x->ex_pathlen != -1) {
                CB_FAIL_IF((x->ex_flags & EXFLAG_CA) == 0,
                           ctx, x, i, X509_V_ERR_PATHLEN_INVALID_FOR_NON_CA);
                CB_FAIL_IF((x->ex_kusage & KU_KEY_CERT_SIGN) == 0, ctx,
                           x, i, X509_V_ERR_PATHLEN_WITHOUT_KU_KEY_CERT_SIGN);
            }
            CB_FAIL_IF((x->ex_flags & EXFLAG_CA) != 0
                           && (x->ex_flags & EXFLAG_BCONS) != 0
                           && (x->ex_flags & EXFLAG_BCONS_CRITICAL) == 0,
                       ctx, x, i, X509_V_ERR_CA_BCONS_NOT_CRITICAL);
            /* Check Key Usage according to RFC 5280 section 4.2.1.3 */
            if ((x->ex_flags & EXFLAG_CA) != 0) {
                CB_FAIL_IF((x->ex_flags & EXFLAG_KUSAGE) == 0,
                           ctx, x, i, X509_V_ERR_CA_CERT_MISSING_KEY_USAGE);
            } else {
                CB_FAIL_IF((x->ex_kusage & KU_KEY_CERT_SIGN) != 0, ctx, x, i,
                           X509_V_ERR_KU_KEY_CERT_SIGN_INVALID_FOR_NON_CA);
            }
            /* Check issuer is non-empty acc. to RFC 5280 section 4.1.2.4 */
            CB_FAIL_IF(X509_NAME_entry_count(X509_get_issuer_name(x)) == 0,
                       ctx, x, i, X509_V_ERR_ISSUER_NAME_EMPTY);
            /* Check subject is non-empty acc. to RFC 5280 section 4.1.2.6 */
            CB_FAIL_IF(((x->ex_flags & EXFLAG_CA) != 0
                        || (x->ex_kusage & KU_CRL_SIGN) != 0
                        || x->altname == NULL)
                       && X509_NAME_entry_count(X509_get_subject_name(x)) == 0,
                       ctx, x, i, X509_V_ERR_SUBJECT_NAME_EMPTY);
            CB_FAIL_IF(X509_NAME_entry_count(X509_get_subject_name(x)) == 0
                           && x->altname != NULL
                           && (x->ex_flags & EXFLAG_SAN_CRITICAL) == 0,
                       ctx, x, i, X509_V_ERR_EMPTY_SUBJECT_SAN_NOT_CRITICAL);
            /* Check SAN is non-empty according to RFC 5280 section 4.2.1.6 */
            CB_FAIL_IF(x->altname != NULL
                           && sk_GENERAL_NAME_num(x->altname) <= 0,
                       ctx, x, i, X509_V_ERR_EMPTY_SUBJECT_ALT_NAME);
            /* Check sig alg consistency acc. to RFC 5280 section 4.1.1.2 */
            CB_FAIL_IF(X509_ALGOR_cmp(&x->sig_alg, &x->cert_info.signature) != 0,
                       ctx, x, i, X509_V_ERR_SIGNATURE_ALGORITHM_INCONSISTENCY);
            CB_FAIL_IF(x->akid != NULL
                           && (x->ex_flags & EXFLAG_AKID_CRITICAL) != 0,
                       ctx, x, i, X509_V_ERR_AUTHORITY_KEY_IDENTIFIER_CRITICAL);
            CB_FAIL_IF(x->skid != NULL
                           && (x->ex_flags & EXFLAG_SKID_CRITICAL) != 0,
                       ctx, x, i, X509_V_ERR_SUBJECT_KEY_IDENTIFIER_CRITICAL);
            if (X509_get_version(x) >= X509_VERSION_3) {
                /* Check AKID presence acc. to RFC 5280 section 4.2.1.1 */
                CB_FAIL_IF(i + 1 < num /*
                                        * this means not last cert in chain,
                                        * taken as "generated by conforming CAs"
                                        */
                           && (x->akid == NULL || x->akid->keyid == NULL), ctx,
                           x, i, X509_V_ERR_MISSING_AUTHORITY_KEY_IDENTIFIER);
                /* Check SKID presence acc. to RFC 5280 section 4.2.1.2 */
                CB_FAIL_IF((x->ex_flags & EXFLAG_CA) != 0 && x->skid == NULL,
                           ctx, x, i, X509_V_ERR_MISSING_SUBJECT_KEY_IDENTIFIER);
            } else {
                CB_FAIL_IF(sk_X509_EXTENSION_num(X509_get0_extensions(x)) > 0,
                           ctx, x, i, X509_V_ERR_EXTENSIONS_REQUIRE_VERSION_3);
            }
        }

        /* check_purpose() makes the callback as needed */
        if (purpose > 0 && !check_purpose(ctx, x, purpose, i, must_be_ca))
            return 0;
        /* Check path length */
        CB_FAIL_IF(i > 1 && x->ex_pathlen != -1
                       && plen > x->ex_pathlen + proxy_path_length,
                   ctx, x, i, X509_V_ERR_PATH_LENGTH_EXCEEDED);
        /* Increment path length if not a self-issued intermediate CA */
        if (i > 0 && (x->ex_flags & EXFLAG_SI) == 0)
            plen++;
        /*
         * If this certificate is a proxy certificate, the next certificate
         * must be another proxy certificate or a EE certificate.  If not,
         * the next certificate must be a CA certificate.
         */
        if (x->ex_flags & EXFLAG_PROXY) {
            /*
             * RFC3820, 4.1.3 (b)(1) stipulates that if pCPathLengthConstraint
             * is less than max_path_length, the former should be copied to
             * the latter, and 4.1.4 (a) stipulates that max_path_length
             * should be verified to be larger than zero and decrement it.
             *
             * Because we're checking the certs in the reverse order, we start
             * with verifying that proxy_path_length isn't larger than pcPLC,
             * and copy the latter to the former if it is, and finally,
             * increment proxy_path_length.
             */
            if (x->ex_pcpathlen != -1) {
                CB_FAIL_IF(proxy_path_length > x->ex_pcpathlen,
                           ctx, x, i, X509_V_ERR_PROXY_PATH_LENGTH_EXCEEDED);
                proxy_path_length = x->ex_pcpathlen;
            }
            proxy_path_length++;
            must_be_ca = 0;
        } else {
            must_be_ca = 1;
        }
    }
    return 1;
}